

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF16CollationIterator::operator==
          (FCDUTF16CollationIterator *this,CollationIterator *other)

{
  UBool UVar1;
  bool local_31;
  FCDUTF16CollationIterator *o;
  CollationIterator *other_local;
  FCDUTF16CollationIterator *this_local;
  
  UVar1 = CollationIterator::operator==((CollationIterator *)this,other);
  if (UVar1 == '\0') {
    this_local._7_1_ = false;
  }
  else if (this->checkDir == (char)other[1].ceBuffer.buffer.stackArray[10]) {
    if ((this->checkDir == '\0') &&
       (((this->super_UTF16CollationIterator).start == this->segmentStart) !=
        (other[1].super_UObject._vptr_UObject == (_func_int **)other[1].ceBuffer.buffer.ptr))) {
      this_local._7_1_ = false;
    }
    else if ((this->checkDir == '\0') &&
            ((this->super_UTF16CollationIterator).start != this->segmentStart)) {
      local_31 = false;
      if ((long)this->segmentStart - (long)this->rawStart >> 1 ==
          (long)other[1].ceBuffer.buffer.ptr - *(long *)&other[1].ceBuffer >> 1) {
        local_31 = (long)(this->super_UTF16CollationIterator).pos -
                   (long)(this->super_UTF16CollationIterator).start >> 1 ==
                   (long)other[1].trie - (long)other[1].super_UObject._vptr_UObject >> 1;
      }
      this_local._7_1_ = local_31;
    }
    else {
      this_local._7_1_ =
           (long)(this->super_UTF16CollationIterator).pos - (long)this->rawStart >> 1 ==
           (long)other[1].trie - *(long *)&other[1].ceBuffer >> 1;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool
FCDUTF16CollationIterator::operator==(const CollationIterator &other) const {
    // Skip the UTF16CollationIterator and call its parent.
    if(!CollationIterator::operator==(other)) { return FALSE; }
    const FCDUTF16CollationIterator &o = static_cast<const FCDUTF16CollationIterator &>(other);
    // Compare the iterator state but not the text: Assume that the caller does that.
    if(checkDir != o.checkDir) { return FALSE; }
    if(checkDir == 0 && (start == segmentStart) != (o.start == o.segmentStart)) { return FALSE; }
    if(checkDir != 0 || start == segmentStart) {
        return (pos - rawStart) == (o.pos - o.rawStart);
    } else {
        return (segmentStart - rawStart) == (o.segmentStart - o.rawStart) &&
                (pos - start) == (o.pos - o.start);
    }
}